

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetIF.hpp
# Opt level: O0

IF_ADDRS_UNICAST gmlc::netif::getNextAddress(int family,IF_ADDRS_UNICAST addrs)

{
  uint uVar1;
  sockaddr *psVar2;
  undefined8 *in_RSI;
  uint in_EDI;
  int next_family;
  sockaddr *next_sockaddr;
  ifaddrs *next;
  IF_ADDRS_UNICAST local_20;
  
  local_20 = (IF_ADDRS_UNICAST)*in_RSI;
  while( true ) {
    while( true ) {
      while( true ) {
        if (local_20 == (IF_ADDRS_UNICAST)0x0) {
          return (IF_ADDRS_UNICAST)0x0;
        }
        psVar2 = getSockAddr(local_20);
        if (psVar2 != (sockaddr *)0x0) break;
        local_20 = local_20->ifa_next;
      }
      uVar1 = (uint)psVar2->sa_family;
      if ((uVar1 == 2) || (uVar1 == 10)) break;
      local_20 = local_20->ifa_next;
    }
    if (((in_EDI != 2) && (in_EDI != 10)) || (in_EDI == uVar1)) break;
    local_20 = local_20->ifa_next;
  }
  return local_20;
}

Assistant:

inline IF_ADDRS_UNICAST getNextAddress(int family, IF_ADDRS_UNICAST addrs)
    {
#if defined(_WIN32) || defined(__USE_W32_SOCKETS)
        (void)family;
        return addrs->Next;
#else
        auto next = addrs->ifa_next;
        while (next != NULL) {
            // Skip entries with a null sockaddr
            auto next_sockaddr = getSockAddr(next);
            if (next_sockaddr == NULL) {
                next = next->ifa_next;
                continue;
            }

            int next_family = next_sockaddr->sa_family;
            // Skip if the family is not IPv4 or IPv6
            if (next_family != AF_INET && next_family != AF_INET6) {
                next = next->ifa_next;
                continue;
            }
            // Skip if a specific IP family was requested and the family doesn't match
            if ((family == AF_INET || family == AF_INET6) && family != next_family) {
                next = next->ifa_next;
                continue;
            }
            // An address entry meeting the requirements was found, return it
            return next;
        }
        return nullptr;
#endif
    }